

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O3

void TTD::NSLogEvents::SetPropertyAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  long lVar1;
  BOOL BVar2;
  ScriptContext *scriptContext;
  Var instance;
  RecyclableObject *pRVar3;
  Var aValue;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  if (evt->EventKind == SetPropertyActionTag) {
    instance = InflateVarInReplay(executeContext,(TTDVar)evt[1].EventTimeStamp);
    if (instance != (Var)0x0) {
      BVar2 = Js::JavascriptOperators::IsObject(instance);
      if (BVar2 != 0) {
        pRVar3 = Js::VarTo<Js::RecyclableObject>(instance);
        if ((((((pRVar3->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr != scriptContext) {
          instance = Js::CrossSite::MarshalVar(scriptContext,pRVar3,false);
        }
        aValue = InflateVarInReplay(executeContext,*(TTDVar *)(evt + 2));
        if (aValue != (Var)0x0) {
          if ((ulong)aValue >> 0x30 == 0) {
            pRVar3 = Js::VarTo<Js::RecyclableObject>(aValue);
            if ((((((pRVar3->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                scriptContext.ptr != scriptContext) {
              aValue = Js::CrossSite::MarshalVar(scriptContext,pRVar3,false);
            }
          }
          lVar1._0_4_ = evt[3].EventKind;
          lVar1._4_4_ = evt[3].ResultStatus;
          Js::JavascriptOperators::OP_SetProperty
                    (instance,(PropertyId)evt[2].EventTimeStamp,aValue,scriptContext,
                     (PropertyValueInfo *)0x0,(uint)(lVar1 != 0),(Var)0x0);
        }
      }
    }
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void SetPropertyAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTDoubleVarDoubleScalarArgumentAction* action = GetInlineEventDataAs<JsRTDoubleVarDoubleScalarArgumentAction, EventKind::SetPropertyActionTag>(evt);
            Js::Var var = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_OBJECT(var, ctx);
            Js::Var value = InflateVarInReplay(executeContext, GetVarItem_1(action));
            TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(value, ctx);

            Js::JavascriptOperators::OP_SetProperty(var, GetPropertyIdItem(action), value, ctx, nullptr, GetScalarItem_1(action) ? Js::PropertyOperation_StrictMode : Js::PropertyOperation_None);
        }